

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_test(OpenJTalk *oj,void *text)

{
  _Bool _Var1;
  int i;
  long lVar2;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return;
  }
  oj->errorCode = OPENJTALKERROR_NO_ERROR;
  g_psd->data = (short *)0x0;
  _Var1 = g_verbose;
  g_verbose = true;
  fwrite("***** test start *****\n",0x17,1,_stderr);
  if (text == (void *)0x0) {
    openjtalk_speakSync(oj,anon_var_dwarf_9a1);
  }
  else {
    fwrite("* hex dump\n",0xb,1,_stderr);
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
      fprintf(_stderr,"%02x ",(ulong)*(byte *)((long)text + lVar2));
      if ((~(uint)lVar2 & 0xf) == 0) {
        fputc(10,_stderr);
      }
    }
    fputc(10,_stderr);
    fwrite("* encoding in UTF-16le\n",0x17,1,_stderr);
    openjtalk_speakSyncU16(oj,(char16_t *)text);
    fwrite("* encoding in UTF-8\n",0x14,1,_stderr);
    openjtalk_speakSync(oj,(char *)text);
    fwrite("* encoding in SHIFT_JIS\n",0x18,1,_stderr);
    openjtalk_speakSyncSjis(oj,(char *)text);
  }
  fwrite("***** finished *****\n\n",0x16,1,_stderr);
  g_verbose = _Var1;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_test(OpenJTalk *oj, void *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	g_psd->data = NULL;

	bool temp = g_verbose;
	g_verbose = true;
	fprintf(stderr, u8"***** test start *****\n");

	if (text != NULL)
	{
		fprintf(stderr, u8"* hex dump\n");
		char *temp_char = (char *)text;
		for (int i = 0; i <= 127; i++)
		{
			fprintf(stderr, u8"%02x ", temp_char[i] & 0xff);
			if (i % 16 == 15)
			{
				fprintf(stderr, u8"\n");
			}
		}
		fprintf(stderr, u8"\n");

		fprintf(stderr, u8"* encoding in UTF-16le\n");
		char16_t *temp_char16 = (char16_t *)text;
		openjtalk_speakSyncU16(oj, temp_char16);

		fprintf(stderr, u8"* encoding in UTF-8\n");
		char *temp_char_utf8 = (char *)text;
		openjtalk_speakSync(oj, temp_char_utf8);

		fprintf(stderr, u8"* encoding in SHIFT_JIS\n");
		char *temp_charSjis = (char *)text;
		openjtalk_speakSyncSjis(oj, temp_charSjis);
	}
	else
	{
		openjtalk_speakSync(oj, u8"聞こえますか？");
	}
	fprintf(stderr, u8"***** finished *****\n\n");
	g_verbose = temp;
}